

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_content_chunked(Stream *strm,ContentReceiverWithProgress *out)

{
  string *this;
  char **ppcVar1;
  char *pcVar2;
  bool bVar3;
  __ssize_t _Var4;
  char **__lineptr;
  string *psVar5;
  FILE *in_RCX;
  FILE *__stream;
  size_t *in_RDX;
  size_t *__n;
  size_t *__n_00;
  size_t *__n_01;
  char **__endptr;
  char *end_ptr;
  stream_line_reader line_reader;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  char buf [16];
  
  this = &line_reader.glowable_buffer_;
  line_reader.fixed_buffer_ = buf;
  line_reader.fixed_buffer_size_ = 0x10;
  line_reader.fixed_buffer_used_size_ = 0;
  line_reader.glowable_buffer_._M_dataplus._M_p = (pointer)&line_reader.glowable_buffer_.field_2;
  line_reader.glowable_buffer_._M_string_length = 0;
  line_reader.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  line_reader.strm_ = strm;
  _Var4 = stream_line_reader::getline(&line_reader,(char **)out,in_RDX,in_RCX);
  if ((char)_Var4 != '\0') {
    ppcVar1 = &line_reader.fixed_buffer_;
    while( true ) {
      psVar5 = this;
      if (line_reader.glowable_buffer_._M_string_length == 0) {
        psVar5 = (string *)ppcVar1;
      }
      __endptr = &end_ptr;
      __lineptr = (char **)strtoul((psVar5->_M_dataplus)._M_p,__endptr,0x10);
      psVar5 = (string *)ppcVar1;
      if (line_reader.glowable_buffer_._M_string_length != 0) {
        psVar5 = this;
      }
      if ((end_ptr == (psVar5->_M_dataplus)._M_p) || (__lineptr == (char **)0xffffffffffffffff))
      goto LAB_001121f8;
      if (__lineptr == (char **)0x0) break;
      local_78 = 0;
      uStack_70 = 0;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                 &stack0xffffffffffffffb0,out);
      __stream = (FILE *)&stack0xffffffffffffffb0;
      bVar3 = read_content_with_length
                        (strm,(uint64_t)__lineptr,(Progress *)&local_88,
                         (ContentReceiverWithProgress *)&stack0xffffffffffffffb0);
      std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb0);
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      if ((!bVar3) ||
         (_Var4 = stream_line_reader::getline(&line_reader,__lineptr,__n_00,__stream),
         (char)_Var4 == '\0')) goto LAB_001121f8;
      psVar5 = this;
      if (line_reader.glowable_buffer_._M_string_length == 0) {
        psVar5 = (string *)ppcVar1;
      }
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      if (((*pcVar2 != '\r') || (pcVar2[1] != '\n')) || (pcVar2[2] != '\0')) goto LAB_00112216;
      _Var4 = stream_line_reader::getline(&line_reader,__lineptr,__n_01,__stream);
      if ((char)_Var4 == '\0') goto LAB_001121f8;
    }
    _Var4 = stream_line_reader::getline(&line_reader,__endptr,__n,(FILE *)end_ptr);
    if ((char)_Var4 != '\0') {
      psVar5 = &line_reader.glowable_buffer_;
      if (line_reader.glowable_buffer_._M_string_length == 0) {
        psVar5 = (string *)&line_reader.fixed_buffer_;
      }
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      if (((*pcVar2 == '\r') && (pcVar2[1] == '\n')) && (pcVar2[2] == '\0')) {
LAB_00112216:
        bVar3 = true;
        goto LAB_001121fa;
      }
    }
  }
LAB_001121f8:
  bVar3 = false;
LAB_001121fa:
  std::__cxx11::string::~string((string *)this);
  return bVar3;
}

Assistant:

inline bool read_content_chunked(Stream &strm,
										 ContentReceiverWithProgress out) {
			const auto bufsiz = 16;
			char buf[bufsiz];

			stream_line_reader line_reader(strm, buf, bufsiz);

			if (!line_reader.getline()) { return false; }

			unsigned long chunk_len;
			while (true) {
				char *end_ptr;

				chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

				if (end_ptr == line_reader.ptr()) { return false; }
				if (chunk_len == ULONG_MAX) { return false; }

				if (chunk_len == 0) { break; }

				if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
					return false;
				}

				if (!line_reader.getline()) { return false; }

				if (strcmp(line_reader.ptr(), "\r\n")) { break; }

				if (!line_reader.getline()) { return false; }
			}

			if (chunk_len == 0) {
				// Reader terminator after chunks
				if (!line_reader.getline() || strcmp(line_reader.ptr(), "\r\n"))
					return false;
			}

			return true;
		}